

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O0

int Fraig_ManCheckClauseUsingSimInfo(Fraig_Man_t *p,Fraig_Node_t *pNode1,Fraig_Node_t *pNode2)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int local_34;
  int i;
  int fCompl2;
  int fCompl1;
  Fraig_Node_t *pNode2_local;
  Fraig_Node_t *pNode1_local;
  Fraig_Man_t *p_local;
  
  uVar1 = (uint)pNode1 & 1 ^ 1 ^ *(uint *)(((ulong)pNode1 & 0xfffffffffffffffe) + 0x18) & 1;
  uVar2 = (uint)pNode2 & 1 ^ 1 ^ *(uint *)(((ulong)pNode2 & 0xfffffffffffffffe) + 0x18) & 1;
  uVar3 = (ulong)pNode1 & 0xfffffffffffffffe;
  uVar4 = (ulong)pNode2 & 0xfffffffffffffffe;
  if (uVar3 == uVar4) {
    __assert_fail("pNode1 != pNode2",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fraig/fraigMan.c"
                  ,0x1cf,
                  "int Fraig_ManCheckClauseUsingSimInfo(Fraig_Man_t *, Fraig_Node_t *, Fraig_Node_t *)"
                 );
  }
  if ((uVar1 == 0) || (uVar2 == 0)) {
    if ((uVar1 == 0) && (uVar2 != 0)) {
      for (local_34 = 0; local_34 < p->nWordsRand; local_34 = local_34 + 1) {
        if ((*(uint *)(*(long *)(uVar3 + 0x68) + (long)local_34 * 4) &
            (*(uint *)(*(long *)(uVar4 + 0x68) + (long)local_34 * 4) ^ 0xffffffff)) != 0) {
          return 0;
        }
      }
      for (local_34 = 0; local_34 < p->iWordStart; local_34 = local_34 + 1) {
        if ((*(uint *)(*(long *)(uVar3 + 0x70) + (long)local_34 * 4) &
            (*(uint *)(*(long *)(uVar4 + 0x70) + (long)local_34 * 4) ^ 0xffffffff)) != 0) {
          return 0;
        }
      }
    }
    else if ((uVar1 == 0) || (uVar2 != 0)) {
      for (local_34 = 0; local_34 < p->nWordsRand; local_34 = local_34 + 1) {
        if ((*(uint *)(*(long *)(uVar3 + 0x68) + (long)local_34 * 4) &
            *(uint *)(*(long *)(uVar4 + 0x68) + (long)local_34 * 4)) != 0) {
          return 0;
        }
      }
      for (local_34 = 0; local_34 < p->iWordStart; local_34 = local_34 + 1) {
        if ((*(uint *)(*(long *)(uVar3 + 0x70) + (long)local_34 * 4) &
            *(uint *)(*(long *)(uVar4 + 0x70) + (long)local_34 * 4)) != 0) {
          return 0;
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < p->nWordsRand; local_34 = local_34 + 1) {
        if (((*(uint *)(*(long *)(uVar3 + 0x68) + (long)local_34 * 4) ^ 0xffffffff) &
            *(uint *)(*(long *)(uVar4 + 0x68) + (long)local_34 * 4)) != 0) {
          return 0;
        }
      }
      for (local_34 = 0; local_34 < p->iWordStart; local_34 = local_34 + 1) {
        if (((*(uint *)(*(long *)(uVar3 + 0x70) + (long)local_34 * 4) ^ 0xffffffff) &
            *(uint *)(*(long *)(uVar4 + 0x70) + (long)local_34 * 4)) != 0) {
          return 0;
        }
      }
    }
  }
  else {
    for (local_34 = 0; local_34 < p->nWordsRand; local_34 = local_34 + 1) {
      if (((*(uint *)(*(long *)(uVar3 + 0x68) + (long)local_34 * 4) ^ 0xffffffff) &
          (*(uint *)(*(long *)(uVar4 + 0x68) + (long)local_34 * 4) ^ 0xffffffff)) != 0) {
        return 0;
      }
    }
    for (local_34 = 0; local_34 < p->iWordStart; local_34 = local_34 + 1) {
      if (((*(uint *)(*(long *)(uVar3 + 0x70) + (long)local_34 * 4) ^ 0xffffffff) &
          (*(uint *)(*(long *)(uVar4 + 0x70) + (long)local_34 * 4) ^ 0xffffffff)) != 0) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int Fraig_ManCheckClauseUsingSimInfo( Fraig_Man_t * p, Fraig_Node_t * pNode1, Fraig_Node_t * pNode2 )
{
    int fCompl1, fCompl2, i;

    fCompl1 = 1 ^ Fraig_IsComplement(pNode1) ^ Fraig_Regular(pNode1)->fInv;
    fCompl2 = 1 ^ Fraig_IsComplement(pNode2) ^ Fraig_Regular(pNode2)->fInv;

    pNode1 = Fraig_Regular(pNode1);
    pNode2 = Fraig_Regular(pNode2);
    assert( pNode1 != pNode2 );
    
    // check the simulation info
    if ( fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( ~pNode1->puSimR[i] & ~pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( ~pNode1->puSimD[i] & ~pNode2->puSimD[i] )
                return 0;
        return 1;
    }
    if ( !fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( pNode1->puSimR[i] & ~pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( pNode1->puSimD[i] & ~pNode2->puSimD[i] )
                return 0;
        return 1;
    }
    if ( fCompl1 && !fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( ~pNode1->puSimR[i] & pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( ~pNode1->puSimD[i] & pNode2->puSimD[i] )
                return 0;
        return 1;
    }
//    if ( fCompl1 && fCompl2 )
    {
        for ( i = 0; i < p->nWordsRand; i++ )
            if ( pNode1->puSimR[i] & pNode2->puSimR[i] )
                return 0;
        for ( i = 0; i < p->iWordStart; i++ )
            if ( pNode1->puSimD[i] & pNode2->puSimD[i] )
                return 0;
        return 1;
    }
}